

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_info.cc
# Opt level: O3

void __thiscall bloaty::dwarf::LineInfoReader::SpecialOpcodeAdvance(LineInfoReader *this,uint8_t op)

{
  ushort uVar1;
  long lVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint8_t uVar5;
  ushort uVar6;
  
  lVar2 = (ulong)(this->info_).op_index +
          (ulong)((byte)(op - (this->params_).opcode_base) / (this->params_).line_range);
  uVar4 = (ulong)(this->params_).minimum_instruction_length;
  uVar6 = (ushort)(this->params_).maximum_operations_per_instruction;
  if (uVar6 == 1) {
    uVar3 = lVar2 * uVar4 + (this->info_).address;
    uVar5 = '\0';
  }
  else {
    uVar1 = (ushort)lVar2;
    uVar5 = (uint8_t)(uVar1 % uVar6);
    uVar3 = (uVar1 / uVar6) * uVar4 + (this->info_).address;
  }
  (this->info_).address = uVar3;
  (this->info_).op_index = uVar5;
  return;
}

Assistant:

uint8_t LineInfoReader::AdjustedOpcode(uint8_t op) {
  return op - params_.opcode_base;
}